

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O3

int vfio_setup_interrupt(int device_fd)

{
  __off_t __offset;
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  size_t sVar7;
  void *pvVar8;
  int __timeout;
  epoll_event *__events;
  code *pcVar9;
  undefined4 uVar10;
  ulong uVar11;
  char *__buf;
  epoll_event *peVar12;
  long lVar13;
  char *pcVar14;
  vfio_irq_info irq;
  char buf [512];
  undefined8 auStack_2b90 [2];
  size_t asStack_2b80 [67];
  long lStack_2968;
  int iStack_2960;
  uint uStack_295c;
  undefined8 uStack_2958;
  undefined1 auStack_2950 [512];
  stat sStack_2750;
  char acStack_26c0 [4096];
  char acStack_16c0 [4096];
  ulong auStack_6c0 [3];
  epoll_event aeStack_6a4 [33];
  undefined8 uStack_490;
  undefined8 uStack_488;
  epoll_event aeStack_480 [32];
  undefined1 auStack_280 [8];
  ulong uStack_278;
  undefined1 *puStack_270;
  char *pcStack_268;
  char *pcStack_260;
  char *pcStack_258;
  code *pcStack_250;
  ulong local_248;
  int local_240;
  undefined4 local_23c;
  undefined1 local_238 [520];
  
  pcVar14 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c";
  pcStack_250 = (code *)0x10744e;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar9 = (code *)0x2;
  while( true ) {
    uVar11 = 0x3b6d;
    local_248 = 0x10;
    iVar4 = (int)pcVar9;
    local_23c = 0;
    pcStack_250 = (code *)0x107482;
    local_240 = iVar4;
    iVar2 = ioctl(device_fd,0x3b6d,&local_248);
    if (iVar2 == -1) break;
    if ((local_248 & 0x100000000) != 0) goto LAB_001074b7;
    pcStack_250 = (code *)0x1074ad;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0xa0,"vfio_setup_interrupt");
    pcVar9 = (code *)(ulong)(iVar4 - 1);
    if (iVar4 == 0) {
      pcVar9 = (code *)0xffffffff;
LAB_001074b7:
      return (int)pcVar9;
    }
  }
  iVar2 = (int)local_238;
  pcStack_250 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_1();
  pcStack_258 = "vfio_setup_interrupt";
  pcStack_260 = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
  ;
  pcStack_268 = "[DEBUG] %s:%d %s(): IRQ doesn\'t support Event FD\n";
  lVar1 = -((uVar11 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_480 + lVar1);
  uStack_278 = (ulong)(uint)device_fd;
  puStack_270 = (undefined1 *)&local_248;
  pcStack_250 = pcVar9;
  *(undefined8 *)((long)&uStack_488 + lVar1) = 0x107510;
  uVar3 = epoll_wait(iVar2,__events,(int)uVar11,__timeout);
  if (uVar3 != 0xffffffff) {
    pcVar14 = (char *)(ulong)uVar3;
    if (0 < (int)uVar3) {
      lVar13 = 0;
      do {
        iVar2 = *(int *)((long)aeStack_480 + lVar13 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_488 + lVar1) = 0x107540;
        sVar6 = read(iVar2,auStack_280,8);
        if (sVar6 == -1) {
          *(undefined8 *)((long)&uStack_488 + lVar1) = 0x10756d;
          vfio_epoll_wait_cold_1();
          goto LAB_0010756d;
        }
        lVar13 = lVar13 + 0xc;
      } while ((long)pcVar14 * 0xc != lVar13);
    }
    return uVar3;
  }
LAB_0010756d:
  peVar12 = aeStack_480;
  *(code **)((long)&uStack_488 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_488 + lVar1) = &pcStack_250;
  *(epoll_event **)((long)&uStack_490 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_6a4 + lVar1) = 1;
  *(int *)((long)aeStack_6a4 + lVar1 + 4) = (int)peVar12;
  *(undefined8 *)((long)auStack_6c0 + lVar1 + 0x10) = 0x107597;
  uVar3 = epoll_create1(0);
  if (uVar3 == 0xffffffff) {
    *(undefined8 *)((long)auStack_6c0 + lVar1 + 0x10) = 0x1075cc;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar3;
    *(undefined8 *)((long)auStack_6c0 + lVar1 + 0x10) = 0x1075b1;
    iVar2 = epoll_ctl(uVar3,1,(int)peVar12,(epoll_event *)((long)aeStack_6a4 + lVar1));
    if (iVar2 != -1) {
      return uVar3;
    }
  }
  lVar13 = (long)aeStack_6a4 + lVar1 + 0xc;
  *(code **)((long)auStack_6c0 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_6c0 + lVar1 + 0x10) = (ulong)peVar12 & 0xffffffff;
  *(char **)((long)auStack_6c0 + lVar1 + 8) = pcVar14;
  *(epoll_event **)((long)auStack_6c0 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107605;
  snprintf(acStack_16c0 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar13);
  *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107615;
  iVar2 = stat(acStack_16c0 + lVar1,(stat *)((long)&sStack_2750 + lVar1));
  if (iVar2 < 0) {
    return -1;
  }
  pcVar14 = acStack_16c0 + lVar1;
  *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10762d;
  sVar7 = strlen(pcVar14);
  *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107644;
  strncat(pcVar14,"iommu_group",0xfff - sVar7);
  __buf = acStack_26c0 + lVar1;
  *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107659;
  sVar6 = readlink(pcVar14,__buf,0x1000);
  uVar10 = SUB84(__buf,0);
  if (sVar6 == -1) {
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1077ee;
    vfio_init_cold_11();
LAB_001077ee:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1077f8;
    vfio_init_cold_10();
LAB_001077f8:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107802;
    vfio_init_cold_8();
LAB_00107802:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10780c;
    vfio_init_cold_7();
LAB_0010780c:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107816;
    vfio_init_cold_6();
LAB_00107816:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107820;
    vfio_init_cold_5();
LAB_00107820:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10782a;
    vfio_init_cold_3();
LAB_0010782a:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107834;
    vfio_init_cold_9();
LAB_00107834:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10783e;
    vfio_init_cold_1();
LAB_0010783e:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107848;
    vfio_init_cold_2();
  }
  else {
    acStack_26c0[(int)sVar6 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10767a;
    pcVar14 = __xpg_basename(acStack_26c0 + lVar1);
    uVar10 = 0x1084e4;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107690;
    iVar2 = __isoc99_sscanf(pcVar14,"%d",(long)&uStack_295c + lVar1);
    if (iVar2 == -1) goto LAB_001077ee;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1076a0;
    iVar2 = get_vfio_container();
    *(int *)((long)&iStack_2960 + lVar1) = iVar2;
    if (iVar2 == -1) {
      uVar10 = 2;
      *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1076bd;
      iVar4 = open("/dev/vfio/vfio",2);
      if (iVar4 == -1) goto LAB_0010782a;
      *(int *)((long)&iStack_2960 + lVar1) = iVar4;
      *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1076d3;
      set_vfio_container(iVar4);
      uVar10 = 0x3b64;
      *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1076e2;
      iVar5 = ioctl(iVar4,0x3b64);
      if (iVar5 != 0) goto LAB_00107834;
      uVar10 = 0x3b65;
      *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1076fe;
      iVar4 = ioctl(iVar4,0x3b65,1);
      if (iVar4 == 1) goto LAB_00107707;
      goto LAB_0010783e;
    }
LAB_00107707:
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107729;
    snprintf(acStack_16c0 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_295c + lVar1)
            );
    uVar10 = 2;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107738;
    iVar4 = open(acStack_16c0 + lVar1,2);
    if (iVar4 == -1) goto LAB_001077f8;
    uVar10 = 0x3b67;
    *(undefined8 *)((long)&uStack_2958 + lVar1) = 8;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x10775e;
    iVar5 = ioctl(iVar4,0x3b67);
    if (iVar5 == -1) goto LAB_00107802;
    if ((auStack_2950[lVar1 + -4] & 1) == 0) goto LAB_0010780c;
    uVar10 = 0x3b68;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x107784;
    iVar5 = ioctl(iVar4,0x3b68,(long)&iStack_2960 + lVar1);
    if (iVar5 == -1) goto LAB_00107816;
    if (iVar2 != -1) {
LAB_001077af:
      uVar10 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1077c1;
      iVar2 = ioctl(iVar4,0x3b6a,lVar13);
      if (iVar2 != -1) {
        *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1077cf;
        vfio_enable_dma(iVar2);
        return iVar2;
      }
      goto LAB_00107820;
    }
    uVar10 = 0x3b66;
    *(undefined8 *)((long)&lStack_2968 + lVar1) = 0x1077a6;
    iVar2 = ioctl(*(int *)((long)&iStack_2960 + lVar1),0x3b66,1);
    if (iVar2 != -1) goto LAB_001077af;
  }
  iVar2 = (int)auStack_2950 + (int)lVar1;
  *(code **)((long)&lStack_2968 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2968 + lVar1) = lVar13;
  *(undefined8 *)((long)auStack_2b90 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_2b80 + lVar1) = 0;
  *(undefined8 *)((long)asStack_2b80 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_2b80 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_2b80 + lVar1) = uVar10;
  *(undefined8 *)((long)auStack_2b90 + lVar1) = 0x10787d;
  iVar4 = ioctl(iVar2,0x3b6c);
  if (iVar4 != -1) {
    sVar7 = *(size_t *)((long)asStack_2b80 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_2b80 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_2b90 + lVar1) = 0x1078a0;
    pvVar8 = mmap((void *)0x0,sVar7,3,1,iVar2,__offset);
    if (pvVar8 != (void *)0xffffffffffffffff) goto LAB_001078b7;
    *(undefined8 *)((long)auStack_2b90 + lVar1) = 0x1078b0;
    vfio_map_region_cold_1();
  }
  pvVar8 = (void *)0xffffffffffffffff;
LAB_001078b7:
  return (int)pvVar8;
}

Assistant:

int vfio_setup_interrupt(int device_fd) {
	info("Setup VFIO Interrupts");

	for (int i = VFIO_PCI_MSIX_IRQ_INDEX; i >= 0; i--) {
		struct vfio_irq_info irq = {.argsz = sizeof(irq), .index = i};

		check_err(ioctl(device_fd, VFIO_DEVICE_GET_IRQ_INFO, &irq), "get IRQ Info");

		/* if this vector cannot be used with eventfd continue with next*/
		if ((irq.flags & VFIO_IRQ_INFO_EVENTFD) == 0) {
			debug("IRQ doesn't support Event FD");
			continue;
		}

		return i;
	}

	return -1;
}